

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O1

void ogt_vox_test(void)

{
  return;
}

Assistant:

void ogt_vox_test()
    {
        // frame_index looping tests
        {
            const char* test_message = "failed compute_looped_frame_index test";
            (void)test_message;
            // [0,0] = 1 keyframe animation starting at frame 0
            ogt_assert(compute_looped_frame_index( 0,  0, 0 ) == 0, test_message);
            ogt_assert(compute_looped_frame_index( 0,  0, 1 ) == 0, test_message);
            ogt_assert(compute_looped_frame_index( 0,  0, 15) == 0, test_message);
            // [1,1] = 1 keyframe animation starting at frame 1
            ogt_assert(compute_looped_frame_index( 1,  1,  0) == 1, test_message);
            ogt_assert(compute_looped_frame_index( 1,  1,  1) == 1, test_message);
            ogt_assert(compute_looped_frame_index( 1,  1, 15) == 1, test_message);
            // [0,9] = 10 keyframe animation starting at frame 0
            ogt_assert(compute_looped_frame_index( 0,  9,  0) == 0, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9,  4) == 4, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9,  9) == 9, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9, 10) == 0, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9, 11) == 1, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9, 14) == 4, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9, 19) == 9, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9, 21) == 1, test_message);
            // [4,13] = 10 keyframe animation starting at frame 4
            ogt_assert(compute_looped_frame_index(4, 13, 0 ) == 10, test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 3 ) == 13, test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 4 ) == 4,  test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 5 ) == 5,  test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 12) == 12, test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 13) == 13, test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 14) == 4,  test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 21) == 11, test_message);
        }

    }